

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

void whitespace_handler(void *data,char *s,int len)

{
  int iVar1;
  parser_info *info;
  
  if (0 < *(int *)((long)data + 0x50)) {
    return;
  }
  iVar1 = is_whitespace(s,len);
  if (iVar1 == 0) {
    coda_set_error(-400,"non-whitespace character data not allowed here");
    coda_XML_StopParser(*(XML_Parser *)((long)data + 8),'\0');
    *(undefined4 *)((long)data + 0x44) = 1;
  }
  return;
}

Assistant:

static void XMLCALL whitespace_handler(void *data, const char *s, int len)
{
    parser_info *info = (parser_info *)data;

    if (info->unparsed_depth > 0)
    {
        return;
    }

    /* the generic char handler only allows white space (which is ignored) */
    if (!is_whitespace(s, len))
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "non-whitespace character data not allowed here");
        abort_parser(info);
    }
}